

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

void HTS_Tree_clear(HTS_Tree *tree)

{
  HTS_Tree *in_RDI;
  HTS_Pattern *next_pattern;
  HTS_Pattern *pattern;
  HTS_Pattern *local_10;
  
  local_10 = in_RDI->head;
  while (local_10 != (HTS_Pattern *)0x0) {
    local_10 = local_10->next;
    HTS_free((void *)0x198448);
    HTS_free((void *)0x198452);
  }
  if (in_RDI->root != (HTS_Node *)0x0) {
    HTS_Node_clear((HTS_Node *)0x198477);
    HTS_free((void *)0x198485);
  }
  HTS_Tree_initialize(in_RDI);
  return;
}

Assistant:

static void HTS_Tree_clear(HTS_Tree * tree)
{
   HTS_Pattern *pattern, *next_pattern;

   for (pattern = tree->head; pattern; pattern = next_pattern) {
      next_pattern = pattern->next;
      HTS_free(pattern->string);
      HTS_free(pattern);
   }
   if (tree->root != NULL) {
      HTS_Node_clear(tree->root);
      HTS_free(tree->root);
   }
   HTS_Tree_initialize(tree);
}